

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O2

void Hop_ManStop(Hop_Man_t *p)

{
  uint __line;
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  
  if ((p->pConst1->field_0x20 & 0x30) == 0) {
    iVar4 = 0;
    do {
      if (p->vPis->nSize <= iVar4) {
        iVar4 = 0;
        goto LAB_0063577d;
      }
      pvVar1 = Vec_PtrEntry(p->vPis,iVar4);
      iVar4 = iVar4 + 1;
    } while ((*(byte *)((long)pvVar1 + 0x20) & 0x30) == 0);
    __line = 0x5c;
  }
  else {
    __line = 0x5a;
  }
  goto LAB_006358c1;
  while( true ) {
    pvVar1 = Vec_PtrEntry(p_00,iVar4);
    iVar4 = iVar4 + 1;
    if ((*(byte *)((long)pvVar1 + 0x20) & 0x30) != 0) break;
LAB_0063577d:
    p_00 = p->vPos;
    if (p_00->nSize <= iVar4) {
      uVar3 = 0;
      uVar2 = (ulong)(uint)p->nTableSize;
      if (p->nTableSize < 1) {
        uVar2 = uVar3;
      }
      while( true ) {
        if (uVar2 == uVar3) {
          if (p->time1 != 0) {
            Abc_Print((int)p_00,"%s =","time1");
            Abc_Print((int)p_00,"%9.2f sec\n",(double)p->time1 / 1000000.0);
          }
          iVar4 = (int)p_00;
          if (p->time2 != 0) {
            Abc_Print(iVar4,"%s =","time2");
            Abc_Print(iVar4,"%9.2f sec\n",(double)p->time2 / 1000000.0);
          }
          if (p->vChunks != (Vec_Ptr_t *)0x0) {
            Hop_ManStopMemory(p);
          }
          if (p->vPis != (Vec_Ptr_t *)0x0) {
            Vec_PtrFree(p->vPis);
          }
          if (p->vPos != (Vec_Ptr_t *)0x0) {
            Vec_PtrFree(p->vPos);
          }
          if (p->vObjs != (Vec_Ptr_t *)0x0) {
            Vec_PtrFree(p->vObjs);
          }
          free(p->pTable);
          free(p);
          return;
        }
        if ((p->pTable[uVar3] != (Hop_Obj_t *)0x0) && ((p->pTable[uVar3]->field_0x20 & 0x30) != 0))
        break;
        uVar3 = uVar3 + 1;
      }
      __line = 0x60;
      goto LAB_006358c1;
    }
  }
  __line = 0x5e;
LAB_006358c1:
  __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                ,__line,"void Hop_ManStop(Hop_Man_t *)");
}

Assistant:

void Hop_ManStop( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    // make sure the nodes have clean marks
    pObj = Hop_ManConst1(p);
    assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachPi( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachPo( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachNode( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // print time
    if ( p->time1 ) { ABC_PRT( "time1", p->time1 ); }
    if ( p->time2 ) { ABC_PRT( "time2", p->time2 ); }
//    Hop_TableProfile( p );
    if ( p->vChunks )  Hop_ManStopMemory( p );
    if ( p->vPis )     Vec_PtrFree( p->vPis );
    if ( p->vPos )     Vec_PtrFree( p->vPos );
    if ( p->vObjs )    Vec_PtrFree( p->vObjs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}